

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool __thiscall
fmt::v8::detail::compute_width::count_code_points::operator()
          (count_code_points *this,uint32_t cp,string_view param_2)

{
  type tVar1;
  bool local_32;
  bool local_31;
  bool local_25;
  uint32_t cp_local;
  count_code_points *this_local;
  string_view param_2_local;
  
  local_25 = false;
  if (0x10ff < cp) {
    local_31 = true;
    if ((((((((0x115f < cp) && (local_31 = true, cp != 0x2329)) && (local_31 = true, cp != 0x232a))
           && (((cp < 0x2e80 || (0xa4cf < cp)) || (local_31 = true, cp == 0x303f)))) &&
          (((cp < 0xac00 || (local_31 = true, 0xd7a3 < cp)) &&
           ((cp < 0xf900 || (local_31 = true, 0xfaff < cp)))))) &&
         (((cp < 0xfe10 || (local_31 = true, 0xfe19 < cp)) &&
          (((cp < 0xfe30 || (local_31 = true, 0xfe6f < cp)) &&
           ((((cp < 0xff00 || (local_31 = true, 0xff60 < cp)) &&
             ((cp < 0xffe0 || (local_31 = true, 0xffe6 < cp)))) &&
            ((cp < 0x20000 || (local_31 = true, 0x2fffd < cp)))))))))) &&
        ((cp < 0x30000 || (local_31 = true, 0x3fffd < cp)))) &&
       ((cp < 0x1f300 || (local_31 = true, 0x1f64f < cp)))) {
      local_32 = 0x1f8ff < cp && cp < 0x1fa00;
      local_31 = local_32;
    }
    local_25 = local_31;
  }
  tVar1 = to_unsigned<int>(local_25 + 1);
  *this->count = (ulong)tVar1 + *this->count;
  return true;
}

Assistant:

FMT_CONSTEXPR auto operator()(uint32_t cp, string_view) const -> bool {
      *count += detail::to_unsigned(
          1 +
          (cp >= 0x1100 &&
           (cp <= 0x115f ||  // Hangul Jamo init. consonants
            cp == 0x2329 ||  // LEFT-POINTING ANGLE BRACKET
            cp == 0x232a ||  // RIGHT-POINTING ANGLE BRACKET
            // CJK ... Yi except IDEOGRAPHIC HALF FILL SPACE:
            (cp >= 0x2e80 && cp <= 0xa4cf && cp != 0x303f) ||
            (cp >= 0xac00 && cp <= 0xd7a3) ||    // Hangul Syllables
            (cp >= 0xf900 && cp <= 0xfaff) ||    // CJK Compatibility Ideographs
            (cp >= 0xfe10 && cp <= 0xfe19) ||    // Vertical Forms
            (cp >= 0xfe30 && cp <= 0xfe6f) ||    // CJK Compatibility Forms
            (cp >= 0xff00 && cp <= 0xff60) ||    // Fullwidth Forms
            (cp >= 0xffe0 && cp <= 0xffe6) ||    // Fullwidth Forms
            (cp >= 0x20000 && cp <= 0x2fffd) ||  // CJK
            (cp >= 0x30000 && cp <= 0x3fffd) ||
            // Miscellaneous Symbols and Pictographs + Emoticons:
            (cp >= 0x1f300 && cp <= 0x1f64f) ||
            // Supplemental Symbols and Pictographs:
            (cp >= 0x1f900 && cp <= 0x1f9ff))));
      return true;
    }